

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int LevelMin,int LevelMax)

{
  sat_solver *psVar1;
  Ivy_Obj_t *p_00;
  uint uVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa2d,
                  "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
  }
  iVar7 = (int)pObj->pNextFan0;
  if (iVar7 != 0) {
    iVar3 = p->pManFraig->nTravIds;
    iVar6 = 0;
    if (pObj->TravId != iVar3) {
      pObj->TravId = iVar3;
      uVar2 = *(uint *)&pObj->field_0x8 >> 0xb;
      iVar3 = uVar2 - LevelMin;
      iVar6 = 0;
      if ((*(uint *)&pObj->field_0x8 & 0xf) != 1 && ((uint)LevelMin <= uVar2 && iVar3 != 0)) {
        psVar1 = p->pSat;
        psVar1->factors[iVar7] =
             ((double)iVar3 * p->pParams->dActConeBumpMax) / (double)(LevelMax - LevelMin);
        uVar2 = (psVar1->act_vars).size;
        if (uVar2 == (psVar1->act_vars).cap) {
          iVar3 = (uVar2 >> 1) * 3;
          if ((int)uVar2 < 4) {
            iVar3 = uVar2 * 2;
          }
          piVar4 = (psVar1->act_vars).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar3 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar3 << 2);
          }
          (psVar1->act_vars).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(psVar1->act_vars).cap * 9.5367431640625e-07,
                   (double)iVar3 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          (psVar1->act_vars).cap = iVar3;
          uVar2 = (psVar1->act_vars).size;
        }
        (psVar1->act_vars).size = uVar2 + 1;
        (psVar1->act_vars).ptr[(int)uVar2] = iVar7;
        p_00 = pObj->pNextFan1;
        iVar6 = 0;
        for (iVar7 = 0; iVar7 < p_00->TravId; iVar7 = iVar7 + 1) {
          pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar7);
          iVar3 = Ivy_FraigSetActivityFactors_rec
                            (p,(Ivy_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe),LevelMin,LevelMax);
          iVar6 = iVar6 + iVar3;
        }
        iVar6 = iVar6 + 1;
      }
    }
    return iVar6;
  }
  __assert_fail("Ivy_ObjSatNum(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0xa2e,
                "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
}

Assistant:

int Ivy_FraigSetActivityFactors_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int LevelMin, int LevelMax )
{
    Vec_Ptr_t * vFanins;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjSatNum(pObj) );
    // skip visited variables
    if ( Ivy_ObjIsTravIdCurrent(p->pManFraig, pObj) )
        return 0;
    Ivy_ObjSetTravIdCurrent(p->pManFraig, pObj);
    // add the PI to the list
    if ( pObj->Level <= (unsigned)LevelMin || Ivy_ObjIsPi(pObj) )
        return 0;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pParams->dActConeBumpMax / ThisBump
    p->pSat->factors[Ivy_ObjSatNum(pObj)] = p->pParams->dActConeBumpMax * (pObj->Level - LevelMin)/(LevelMax - LevelMin);
    veci_push(&p->pSat->act_vars, Ivy_ObjSatNum(pObj));
    // explore the fanins
    vFanins = Ivy_ObjFaninVec( pObj );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, i )
        Counter += Ivy_FraigSetActivityFactors_rec( p, Ivy_Regular(pFanin), LevelMin, LevelMax );
    return 1 + Counter;
}